

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O2

void __thiscall RleTaskScheduler::process(RleTaskScheduler *this,VTask *task)

{
  atomic<unsigned_int> *paVar1;
  uint uVar2;
  bool bVar3;
  uint n;
  uint uVar4;
  
  LOCK();
  paVar1 = &this->_index;
  uVar2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  uVar4 = 0;
  do {
    if (uVar4 == this->_count) {
      if (uVar4 == 0) {
        return;
      }
      TaskQueue<std::shared_ptr<VRleTask>_>::push
                ((this->_q).
                 super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (ulong)uVar2 % (ulong)uVar4,task);
      return;
    }
    bVar3 = TaskQueue<std::shared_ptr<VRleTask>_>::try_push
                      ((this->_q).
                       super__Vector_base<TaskQueue<std::shared_ptr<VRleTask>_>,_std::allocator<TaskQueue<std::shared_ptr<VRleTask>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (ulong)(uVar2 + uVar4) % (ulong)this->_count,task);
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  return;
}

Assistant:

void process(VTask task)
    {
        auto i = _index++;

        for (unsigned n = 0; n != _count; ++n) {
            if (_q[(i + n) % _count].try_push(std::move(task))) return;
        }

        if (_count > 0) {
            _q[i % _count].push(std::move(task));
        }
    }